

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  Node *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
  local_48;
  
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  FindHelper<google::protobuf::MapKey>
            ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
              *)&local_48,(InnerMap *)CONCAT44(extraout_var,iVar2),map_key,(TreeIterator *)0x0);
  pNVar1 = local_48.first.node_;
  if (local_48.first.node_ == (Node *)0x0) {
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
    insert<google::protobuf::MapKey_const&>(&local_48,&this->map_,map_key);
    AllocateMapValue(this,(MapValueRef *)&(local_48.first.node_)->field_0x28);
  }
  (val->super_MapValueConstRef).type_ = *(CppType *)&(local_48.first.node_)->field_0x30;
  (val->super_MapValueConstRef).data_ = *(void **)&(local_48.first.node_)->field_0x28;
  return pNVar1 == (Node *)0x0;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(const MapKey& map_key,
                                             MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    MapValueRef& map_val = map_[map_key];
    AllocateMapValue(&map_val);
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}